

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPushConstantRange * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPushConstantRange>
          (Impl *this,VkPushConstantRange *src,size_t count,ScratchAllocator *alloc)

{
  VkPushConstantRange *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPushConstantRange>(alloc,count);
    if (pVVar1 != (VkPushConstantRange *)0x0) {
      pVVar1 = (VkPushConstantRange *)memmove(pVVar1,src,count * 0xc);
      return pVVar1;
    }
  }
  return (VkPushConstantRange *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}